

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

void coll_tmap_foreach(coll_tmap_t *map,_func_void_void_ptr_void_ptr *visit)

{
  entry_t_conflict *entry;
  entry_t_conflict *peVar1;
  
  entry = entry_first(map->root);
  while (entry != (entry_t_conflict *)0x0) {
    peVar1 = entry_next(entry);
    (*visit)(entry->key,entry->val);
    entry = peVar1;
  }
  return;
}

Assistant:

void coll_tmap_foreach(coll_tmap_t *map, void (*visit)(void *, void *)) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        entry_t *next = entry_next(cur);
        visit(cur->key, cur->val);
        cur = next;
    }
}